

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O2

void __thiscall zstr::ifstream::~ifstream(ifstream *this,void **vtt)

{
  _func_int **pp_Var1;
  long *plVar2;
  char cVar3;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_istream)._vptr_basic_istream = pp_Var1;
  *(void **)((long)&(this->super_istream)._vptr_basic_istream + (long)pp_Var1[-3]) = vtt[3];
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    std::ifstream::close();
  }
  plVar2 = *(long **)(&(this->super_istream).field_0xe8 +
                     (long)(this->super_istream)._vptr_basic_istream[-3]);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_istream)._vptr_basic_istream = pp_Var1;
  *(void **)((long)&(this->super_istream)._vptr_basic_istream + (long)pp_Var1[-3]) = vtt[2];
  (this->super_istream)._M_gcount = 0;
  strict_fstream::ifstream::~ifstream((ifstream *)&(this->super_istream).field_0x10);
  return;
}

Assistant:

virtual ~ifstream() {
    if (_fs.is_open()) close();
    if (rdbuf()) delete rdbuf();
  }